

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPC_OptimizedTree.cpp
# Opt level: O0

void __thiscall Opcode::AABBNoLeafTree::~AABBNoLeafTree(AABBNoLeafTree *this)

{
  AABBNoLeafNode *pAVar1;
  AABBNoLeafNode *pAVar2;
  AABBNoLeafTree *this_local;
  
  (this->super_AABBOptimizedTree)._vptr_AABBOptimizedTree =
       (_func_int **)&PTR__AABBNoLeafTree_003912f0;
  if (this->mNodes != (AABBNoLeafNode *)0x0) {
    pAVar1 = this->mNodes;
    if (pAVar1 != (AABBNoLeafNode *)0x0) {
      for (pAVar2 = pAVar1 + pAVar1[-1].mNegData; pAVar1 != pAVar2; pAVar2 = pAVar2 + -1) {
      }
      operator_delete__(&pAVar1[-1].mNegData,pAVar1[-1].mNegData * 0x28 + 8);
    }
    this->mNodes = (AABBNoLeafNode *)0x0;
  }
  AABBOptimizedTree::~AABBOptimizedTree(&this->super_AABBOptimizedTree);
  return;
}

Assistant:

AABBNoLeafTree::~AABBNoLeafTree()
{
	DELETEARRAY(mNodes);
}